

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O0

void deserialize_run_container_empty(void)

{
  void *unaff_retaddr;
  uint8_t data [11];
  undefined5 in_stack_fffffffffffffff0;
  
  invalid_deserialize_test(unaff_retaddr,0x100,(char *)CONCAT35(0x303b,in_stack_fffffffffffffff0));
  return;
}

Assistant:

DEFINE_TEST(deserialize_run_container_empty) {
    // clang-format off
    const uint8_t data[] = {
        0x3B, 0x30, // Serial Cookie
        0, 0,       // Container count - 1
        0x01,       // Run Flag Bitset (single container is a run)
        0, 0,       // Upper 16 bits of the first container
        0, 0,       // Cardinality - 1 of the first container
        0, 0,       // First Container - Number of runs
    };
    // clang-format on
    invalid_deserialize_test(data, sizeof(data), "empty run container");
}